

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.cpp
# Opt level: O3

bool __thiscall IntElemDomain<0,_0,_0>::propagate(IntElemDomain<0,_0,_0> *this)

{
  uint *puVar1;
  int *piVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  _func_int **pp_Var9;
  IntVar *pIVar10;
  Tchar *pTVar11;
  ulong uVar12;
  IntVar *pIVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  int *pt;
  Tint *pTVar17;
  ulong uVar18;
  IntView<0> *pIVar19;
  long lVar20;
  TrailElem local_50;
  IntVar *local_40;
  long local_38;
  
  pIVar13 = (this->y).var;
  iVar7 = (pIVar13->min).v;
  uVar18 = (ulong)iVar7;
  if (iVar7 <= (pIVar13->max).v) {
    do {
      if (((long)(pIVar13->min).v <= (long)uVar18) &&
         ((pIVar13->vals == (Tchar *)0x0 || (pIVar13->vals[uVar18].v != '\0')))) {
        puVar1 = (uint *)this->support[uVar18];
        pTVar17 = this->num_support + uVar18;
        uVar6 = pTVar17->v;
        if ((int)uVar6 < 1) {
          if ((ulong)uVar6 == 0) goto LAB_001a458e;
          bVar3 = false;
          uVar12 = 0;
LAB_001a44aa:
          iVar7 = (int)uVar12;
          if (iVar7 < (int)uVar6) {
            uVar15 = uVar12 & 0xffffffff;
            do {
              puVar1[uVar15 - (long)iVar7] = puVar1[uVar15];
              uVar15 = uVar15 + 1;
              uVar6 = pTVar17->v;
            } while ((long)uVar15 < (long)(int)uVar6);
          }
          iVar4 = uVar6 - iVar7;
          if (bVar3) {
            piVar2 = this->temp_sup;
            uVar15 = 0;
            do {
              puVar1[(long)iVar4 + uVar15] = piVar2[uVar15];
              uVar15 = uVar15 + 1;
            } while ((uVar12 & 0xffffffff) != uVar15);
            uVar6 = pTVar17->v;
            iVar4 = uVar6 - iVar7;
          }
          local_50.sz = 4;
          local_50.pt = &pTVar17->v;
          local_50.x = uVar6;
          vec<TrailElem>::push(&engine.trail,&local_50);
          pTVar17->v = iVar4;
        }
        else {
          uVar5 = *puVar1;
          pIVar13 = (this->x).var;
          iVar7 = (pIVar13->min).v;
          iVar4 = (pIVar13->max).v;
          if (((iVar4 < (int)uVar5 || (int)uVar5 < iVar7) ||
              ((((pIVar13->vals != (Tchar *)0x0 && (pIVar13->vals[(int)uVar5].v == '\0')) ||
                (pIVar10 = (this->a).data[uVar5].var, (long)uVar18 < (long)(pIVar10->min).v)) ||
               ((long)(pIVar10->max).v < (long)uVar18)))) ||
             ((pIVar10->vals != (Tchar *)0x0 && (pIVar10->vals[uVar18].v == '\0')))) {
            uVar15 = 0;
            uVar12 = 0;
            do {
              uVar5 = puVar1[uVar12];
              if ((((int)uVar5 <= iVar4 && iVar7 <= (int)uVar5) &&
                  ((pIVar13->vals == (Tchar *)0x0 || (pIVar13->vals[(int)uVar5].v != '\0')))) &&
                 ((pIVar10 = (this->a).data[uVar5].var, (long)(pIVar10->min).v <= (long)uVar18 &&
                  (((long)uVar18 <= (long)(pIVar10->max).v &&
                   ((pIVar10->vals == (Tchar *)0x0 || (pIVar10->vals[uVar18].v != '\0')))))))) {
                if (uVar6 != (uint)uVar12) {
                  bVar3 = uVar12 != 0;
                  if (uVar12 == 0) {
                    bVar3 = false;
                  }
                  else {
                    piVar2 = this->temp_sup;
                    uVar14 = 0;
                    do {
                      piVar2[uVar14] = puVar1[uVar14];
                      uVar14 = uVar14 + 1;
                    } while (uVar15 != uVar14);
                    uVar6 = pTVar17->v;
                  }
                  goto LAB_001a44aa;
                }
                break;
              }
              uVar12 = uVar12 + 1;
              uVar15 = (ulong)((int)uVar15 + 1);
            } while (uVar6 != uVar12);
LAB_001a458e:
            if (so.lazy == true) {
              pIVar13 = (this->x).var;
              iVar7 = ((pIVar13->max).v - (pIVar13->min).v) + 4;
              local_50.pt = (int *)malloc((long)iVar7 * 4 + 8);
              ((Tint *)local_50.pt)->v = iVar7 * 0x100 | 2;
              vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),(Clause **)&local_50);
              pTVar17 = (Tint *)local_50.pt;
              iVar7 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[8])();
              if ((uint)*&pTVar17->v < 0x200) {
LAB_001a498d:
                abort();
              }
              ((Tint *)(&pTVar17->v + 2))->v = iVar7;
              iVar7 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[9])();
              if ((uint)*&pTVar17->v < 0x300) goto LAB_001a498d;
              ((Tint *)(&pTVar17->v + 3))->v = iVar7;
              pIVar13 = (this->x).var;
              iVar7 = (pIVar13->min).v;
              if (iVar7 <= (pIVar13->max).v) {
                iVar4 = iVar7 + 3;
                uVar12 = (long)iVar7;
                do {
                  iVar7 = (pIVar13->min).v;
                  iVar16 = iVar4 - iVar7;
                  if (((long)uVar12 < (long)iVar7) ||
                     ((pIVar13->vals != (Tchar *)0x0 && (pIVar13->vals[uVar12].v == '\0')))) {
                    pp_Var9 = (pIVar13->super_Var).super_Branching._vptr_Branching;
                    uVar15 = uVar12;
                  }
                  else {
                    pIVar13 = (this->a).data[uVar12 & 0xffffffff].var;
                    pp_Var9 = (pIVar13->super_Var).super_Branching._vptr_Branching;
                    uVar15 = uVar18;
                  }
                  uVar6 = (*pp_Var9[0xd])(pIVar13,uVar15,0);
                  if ((int)((uint)*&pTVar17->v >> 8) <= iVar16) goto LAB_001a498d;
                  ((Tint *)(&pTVar17->v + (long)iVar16 + 1))->v = uVar6 ^ 1;
                  pIVar13 = (this->x).var;
                  iVar4 = iVar4 + 1;
                  bVar3 = (long)uVar12 < (long)(pIVar13->max).v;
                  uVar12 = uVar12 + 1;
                } while (bVar3);
              }
            }
            else {
              pTVar17 = (Tint *)0x0;
            }
            pIVar13 = (this->y).var;
            iVar7 = (*(pIVar13->super_Var).super_Branching._vptr_Branching[0x11])
                              (pIVar13,uVar18,pTVar17,1);
            if ((char)iVar7 == '\0') {
              return false;
            }
          }
        }
      }
      pIVar13 = (this->y).var;
      bVar3 = (long)uVar18 < (long)(pIVar13->max).v;
      uVar18 = uVar18 + 1;
    } while (bVar3);
  }
  pIVar10 = (this->x).var;
  uVar6 = (pIVar10->min).v;
  if (uVar6 != (pIVar10->max).v) {
    return true;
  }
  pIVar19 = (this->a).data;
  pIVar10 = pIVar19[uVar6].var;
  pIVar19 = pIVar19 + uVar6;
  iVar7 = (pIVar10->min).v;
  iVar4 = (pIVar13->min).v;
  if (iVar4 < iVar7) {
    if (so.lazy == true) {
      iVar4 = (*(pIVar10->super_Var).super_Branching._vptr_Branching[8])(pIVar10);
      uVar5 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
      uVar18 = (ulong)uVar5 << 0x20 | (long)iVar4 << 2 | 3;
      pIVar13 = (this->y).var;
    }
    else {
      uVar18 = 0;
    }
    iVar7 = (*(pIVar13->super_Var).super_Branching._vptr_Branching[0xe])
                      (pIVar13,(long)iVar7,uVar18,1);
    if ((char)iVar7 == '\0') {
      return false;
    }
    pIVar13 = (this->y).var;
    iVar4 = (pIVar13->min).v;
    pIVar10 = pIVar19->var;
    iVar7 = (pIVar10->min).v;
  }
  if (iVar7 < iVar4) {
    if (so.lazy == true) {
      iVar7 = (*(pIVar13->super_Var).super_Branching._vptr_Branching[8])();
      uVar5 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
      uVar18 = (ulong)uVar5 << 0x20 | (long)iVar7 << 2 | 3;
      pIVar10 = pIVar19->var;
    }
    else {
      uVar18 = 0;
    }
    iVar7 = (*(pIVar10->super_Var).super_Branching._vptr_Branching[0xe])
                      (pIVar10,(long)iVar4,uVar18,1);
    if ((char)iVar7 == '\0') {
      return false;
    }
    pIVar10 = pIVar19->var;
    pIVar13 = (this->y).var;
  }
  iVar7 = (pIVar10->max).v;
  iVar4 = (pIVar13->max).v;
  if (iVar7 < iVar4) {
    if (so.lazy == true) {
      iVar4 = (*(pIVar10->super_Var).super_Branching._vptr_Branching[9])(pIVar10);
      uVar5 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
      uVar18 = (ulong)uVar5 << 0x20 | (long)iVar4 << 2 | 3;
      pIVar13 = (this->y).var;
    }
    else {
      uVar18 = 0;
    }
    iVar7 = (*(pIVar13->super_Var).super_Branching._vptr_Branching[0xf])
                      (pIVar13,(long)iVar7,uVar18,1);
    if ((char)iVar7 == '\0') {
      return false;
    }
    pIVar13 = (this->y).var;
    iVar4 = (pIVar13->max).v;
    pIVar10 = pIVar19->var;
    iVar7 = (pIVar10->max).v;
  }
  if (iVar4 < iVar7) {
    if (so.lazy == true) {
      iVar7 = (*(pIVar13->super_Var).super_Branching._vptr_Branching[9])();
      uVar5 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
      uVar18 = (ulong)uVar5 << 0x20 | (long)iVar7 << 2 | 3;
      pIVar10 = pIVar19->var;
    }
    else {
      uVar18 = 0;
    }
    iVar7 = (*(pIVar10->super_Var).super_Branching._vptr_Branching[0xf])
                      (pIVar10,(long)iVar4,uVar18,1);
    if ((char)iVar7 == '\0') {
      return false;
    }
  }
  pIVar19 = (this->a).data;
  pIVar13 = pIVar19[uVar6].var;
  local_38 = (long)(int)uVar6;
  iVar7 = (pIVar13->min).v;
  local_40 = pIVar13;
  while( true ) {
    do {
      if (iVar7 == (pIVar13->max).v) {
        iVar4 = -0x80000000;
      }
      else {
        pTVar11 = pIVar13->vals + iVar7;
        iVar4 = iVar7;
        do {
          pTVar11 = pTVar11 + 1;
          iVar4 = iVar4 + 1;
        } while (pTVar11->v == '\0');
      }
      lVar20 = (long)iVar7;
      pIVar10 = (this->y).var;
    } while ((((pIVar10->min).v <= iVar7) && (iVar7 <= (pIVar10->max).v)) &&
            ((iVar7 = iVar4, pIVar10->vals == (Tchar *)0x0 || (pIVar10->vals[lVar20].v != '\0'))));
    if (so.lazy == true) {
      uVar5 = (*(pIVar10->super_Var).super_Branching._vptr_Branching[0xd])(pIVar10,lVar20,0);
      pIVar13 = (this->x).var;
      uVar8 = (*(pIVar13->super_Var).super_Branching._vptr_Branching[0xd])(pIVar13,local_38,1);
      uVar18 = (ulong)(uVar8 ^ 1) << 0x20 | (long)(int)(uVar5 ^ 1) << 2 | 3;
      pIVar13 = local_40;
    }
    else {
      uVar18 = 0;
    }
    iVar7 = (*((pIVar19[uVar6].var)->super_Var).super_Branching._vptr_Branching[0x11])
                      (pIVar19[uVar6].var,lVar20,uVar18,1);
    if ((char)iVar7 == '\0') break;
    pIVar19 = (this->a).data;
    iVar7 = iVar4;
  }
  return false;
}

Assistant:

bool propagate() override {
		// propagate holes in y
		for (int v = static_cast<int>(y.getMin()); v <= static_cast<int>(y.getMax()); v++) {
			if (!y.indomain(v)) {
				continue;
			}
			int* s = support[v];
			int f = 0;
			if (num_support[v] > 0) {
				if (x.indomain(s[0]) && a[s[0]].indomain(v)) {
					continue;
				}
				while (!(x.indomain(s[f]) && a[s[f]].indomain(v)) && ++f < num_support[v]) {
					;
				}
			}
			if (f == num_support[v]) {
				// v has no support, remove from y
				Clause* r = nullptr;
				if (so.lazy) {
					r = Reason_new(static_cast<int>(x.getMax() + 4 - x.getMin()));
					(*r)[1] = x.getMinLit();
					(*r)[2] = x.getMaxLit();
					for (int i = static_cast<int>(x.getMin()); i <= static_cast<int>(x.getMax()); i++) {
						const int reasonIndex = static_cast<int>(3 + i - x.getMin());
						if (x.indomain(i)) {
							const Lit l = ~a[i].getLit(v, LR_NE);
							(*r)[reasonIndex] = l;
						} else {
							const Lit l = ~x.getLit(i, LR_NE);
							(*r)[reasonIndex] = l;
						}
					}
				}
				if (!y.remVal(v, r)) {
					return false;
				}
			} else {
				// shift bad supports to back
				for (int i = 0; i < f; i++) {
					temp_sup[i] = s[i];
				}
				for (int i = f; i < num_support[v]; i++) {
					s[i - f] = s[i];
				}
				s += num_support[v] - f;
				for (int i = 0; i < f; i++) {
					s[i] = temp_sup[i];
				}
				num_support[v] -= f;
			}
		}

		// propagate holes in x
		// just ignore

		// propagate holes in a_i
		if (x.isFixed()) {
			const int v = static_cast<int>(x.getVal());
			const IntView<W>& f = a[v];
			setDom(y, setMin, f.getMin(), f.getMinLit(), x.getValLit());
			setDom(f, setMin, y.getMin(), y.getMinLit(), x.getValLit());
			setDom(y, setMax, f.getMax(), f.getMaxLit(), x.getValLit());
			setDom(f, setMax, y.getMax(), y.getMaxLit(), x.getValLit());
			for (typename IntView<W>::iterator i = a[v].begin(); i != a[v].end();) {
				const int w = *i++;
				if (!y.indomain(w) &&
						!a[v].remVal(w,
												 so.lazy ? Reason(~y.getLit(w, LR_NE), ~x.getLit(v, LR_EQ)) : Reason())) {
					return false;
				}
			}
		}

		return true;
	}